

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_nulloptConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_nulloptConstructor_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this)

{
  bool bVar1;
  storage_type sVar2;
  value_type_conflict *lhs;
  char *pcVar3;
  char *in_R9;
  opt_type o;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  storage_type local_51;
  AssertHelper local_50;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  string local_38;
  AssertHelper local_18;
  
  local_51.null_value = 0xff;
  local_38._M_dataplus._M_p._0_1_ = 1;
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_38._M_dataplus._M_p._0_1_ = '\x01';
  local_38._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<bool,_mp::opt_default_policy<bool>_>::value
              ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_51);
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x131,
             "Expected: o.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  sVar2 = (storage_type)
          (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
  if (local_51.value != true) {
    sVar2 = local_51;
  }
  lhs = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
  local_48.data_._0_1_ = (internal)(sVar2.null_value & 1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"this->value_2","o.value_or(this->value_2)",lhs,(bool *)&local_48
            );
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x132,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_1_ = (internal)(local_51.value == true);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48.data_._0_1_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48,(AssertionResult *)0x1b9777,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x135,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_1_ = (internal)(local_51.value == true);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_48.data_._0_1_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,(internal *)&local_48,(AssertionResult *)"co.has_value()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x136,(char *)CONCAT71(local_38._M_dataplus._M_p._1_7_,
                                      (char)local_38._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        &local_38.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p),
                      local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_50.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<bool,_mp::opt_default_policy<bool>_>::value
              ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_51);
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x137,
             "Expected: co.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(char)local_38._M_dataplus._M_p
                                    ) + 8))();
    }
  }
  sVar2.value = *lhs;
  if (local_51.value != true) {
    sVar2 = local_51;
  }
  local_48.data_._0_1_ = (internal)(sVar2.null_value & 1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_38,"this->value_2","co.value_or(this->value_2)",lhs,
             (bool *)&local_48);
  if ((char)local_38._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_38._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_38._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x138,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_48.data_._1_7_,local_48.data_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_38._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, nulloptConstructor)
{
  using opt_type = typename TestFixture::type;
  opt_type o{nullopt};
  EXPECT_FALSE(o);
  EXPECT_FALSE(o.has_value());
  EXPECT_THROW(o.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o.value_or(this->value_2));

  const opt_type& co{o};
  EXPECT_FALSE(co);
  EXPECT_FALSE(co.has_value());
  EXPECT_THROW(co.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, co.value_or(this->value_2));
}